

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteStates.cpp
# Opt level: O2

void __thiscall MADPComponentDiscreteStates::SetUniformISD(MADPComponentDiscreteStates *this)

{
  pointer pdVar1;
  undefined1 auVar2 [16];
  pointer pdVar3;
  ostream *poVar4;
  undefined1 in_ZMM0 [64];
  
  if (this->_m_initialized != false) {
    auVar2 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,this->_m_nrStates);
    pdVar1 = (this->_m_initialStateDistribution->super_SDV).
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish;
    for (pdVar3 = (this->_m_initialStateDistribution->super_SDV).
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start; pdVar3 != pdVar1; pdVar3 = pdVar3 + 1) {
      *pdVar3 = 1.0 / auVar2._0_8_;
    }
    return;
  }
  poVar4 = std::operator<<((ostream *)&std::cout,
                           " MADPComponentDiscreteStates::SetUniformISD - ERROR can\'t");
  std::operator<<(poVar4,
                  "set uniform init. state distr., when not initialized! (don\'t know how many state yet...)"
                 );
  return;
}

Assistant:

void MADPComponentDiscreteStates::SetUniformISD()
{
    //cout << " MADPComponentDiscreteStates::SetUniformISD called"<<endl;
    if(!_m_initialized)
    {
        cout << " MADPComponentDiscreteStates::SetUniformISD - ERROR can't"<<
            "set uniform init. state distr., when not initialized! (don't know how many state yet...)";
        return;
    }
    double uprob = 1.0 / GetNrStates();
    vector<double>::iterator it = _m_initialStateDistribution->begin();
    vector<double>::iterator last = _m_initialStateDistribution->end();
    while(it!=last)
    {
        *it = uprob;
        it++;
    }
}